

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O2

void __thiscall
QHeaderViewPrivate::sectionsMoved
          (QHeaderViewPrivate *this,QModelIndex *sourceParent,int logicalStart,int logicalEnd,
          QModelIndex *destinationParent,int logicalDestination)

{
  bool bVar1;
  QPersistentModelIndex *rhs;
  long in_FS_OFFSET;
  QArrayDataPointer<QPersistentModelIndex> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  rhs = &(this->super_QAbstractItemViewPrivate).root;
  bVar1 = ::operator!=(sourceParent,rhs);
  if (!bVar1) {
    bVar1 = ::operator!=(destinationParent,rhs);
    if (!bVar1) {
      local_38.d = (Data *)0x0;
      local_38.ptr = (QPersistentModelIndex *)0x0;
      local_38.size = 0;
      sectionsChanged(this,(QList<QPersistentModelIndex> *)rhs,NoLayoutChangeHint);
      QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderViewPrivate::sectionsMoved(const QModelIndex &sourceParent, int logicalStart,
                                       int logicalEnd, const QModelIndex &destinationParent,
                                       int logicalDestination)
{
    if (sourceParent != root || destinationParent != root)
        return; // we only handle changes in the root level
    Q_UNUSED(logicalStart);
    Q_UNUSED(logicalEnd);
    Q_UNUSED(logicalDestination);
    sectionsChanged();
}